

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_profiler.cpp
# Opt level: O1

string * duckdb::RenderTitleCase(string *__return_storage_ptr__,string *str)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  char cVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  string local_38;
  
  StringUtil::Lower(&local_38,(string *)str);
  ::std::__cxx11::string::operator=((string *)str,(string *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  iVar5 = toupper((int)*(str->_M_dataplus)._M_p);
  cVar4 = NumericCastImpl<char,_int,_false>::Convert(iVar5);
  *(str->_M_dataplus)._M_p = cVar4;
  uVar6 = str->_M_string_length;
  if (uVar6 != 0) {
    uVar7 = 0;
    do {
      pcVar2 = (str->_M_dataplus)._M_p;
      if ((pcVar2[uVar7] == '_') && (pcVar2[uVar7] = ' ', uVar7 + 1 < str->_M_string_length)) {
        iVar5 = toupper((int)(str->_M_dataplus)._M_p[uVar7 + 1]);
        cVar4 = NumericCastImpl<char,_int,_false>::Convert(iVar5);
        (str->_M_dataplus)._M_p[uVar7 + 1] = cVar4;
      }
      uVar7 = uVar7 + 1;
      uVar6 = str->_M_string_length;
    } while (uVar7 < uVar6);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (str->_M_dataplus)._M_p;
  paVar1 = &str->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&str->field_2 + 8);
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = pcVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  __return_storage_ptr__->_M_string_length = uVar6;
  (str->_M_dataplus)._M_p = (pointer)paVar1;
  str->_M_string_length = 0;
  (str->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

static string RenderTitleCase(string str) {
	str = StringUtil::Lower(str);
	str[0] = NumericCast<char>(toupper(str[0]));
	for (idx_t i = 0; i < str.size(); i++) {
		if (str[i] == '_') {
			str[i] = ' ';
			if (i + 1 < str.size()) {
				str[i + 1] = NumericCast<char>(toupper(str[i + 1]));
			}
		}
	}
	return str;
}